

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deUniquePtr.hpp
# Opt level: O0

void __thiscall
de::details::
UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
::reset(UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
        *this)

{
  UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  *this_local;
  
  if ((this->m_data).ptr != (Pipeline *)0x0) {
    DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>::operator()
              ((DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline> *)
               &(this->m_data).field_0x8,(this->m_data).ptr);
    (this->m_data).ptr = (Pipeline *)0x0;
  }
  return;
}

Assistant:

void UniqueBase<T, D>::reset (void)
{
	if (m_data.ptr != DE_NULL)
	{
		m_data.deleter(m_data.ptr);
		m_data.ptr = DE_NULL;
	}
}